

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O0

ReaderTablesPtr __thiscall Omega_h::build_reader_tables(Omega_h *this,Language *language)

{
  undefined8 uVar1;
  ReaderTables *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IndentInfo IVar2;
  ReaderTablesPtr RVar3;
  shared_ptr<const_Omega_h::Grammar> local_158;
  ParserInProgress local_148;
  undefined1 local_d8 [8];
  Parser parser;
  GrammarPtr grammar;
  IndentInfo indent_info;
  FiniteAutomaton lexer;
  Language *language_local;
  
  build_lexer((FiniteAutomaton *)&indent_info.dedent_token,language);
  IVar2 = build_indent_info(language);
  indent_info._0_8_ = IVar2._8_8_;
  uVar1 = IVar2._0_8_;
  build_grammar((Omega_h *)&parser.nonterminal_table.ncols,language);
  std::shared_ptr<const_Omega_h::Grammar>::shared_ptr
            (&local_158,(shared_ptr<const_Omega_h::Grammar> *)&parser.nonterminal_table.ncols);
  build_lalr1_parser(&local_148,&local_158,false);
  accept_parser((Parser *)local_d8,&local_148);
  ParserInProgress::~ParserInProgress(&local_148);
  std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_158);
  __p = (ReaderTables *)operator_new(0xa0);
  Parser::Parser((Parser *)__p,(Parser *)local_d8);
  FiniteAutomaton::FiniteAutomaton(&__p->lexer,(FiniteAutomaton *)&indent_info.dedent_token);
  (__p->indent_info).is_sensitive = (bool)(char)uVar1;
  *(int3 *)&(__p->indent_info).field_0x1 = (int3)((ulong)uVar1 >> 8);
  (__p->indent_info).indent_token = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(__p->indent_info).dedent_token = indent_info._0_8_;
  std::shared_ptr<Omega_h::ReaderTables_const>::shared_ptr<Omega_h::ReaderTables,void>
            ((shared_ptr<Omega_h::ReaderTables_const> *)this,__p);
  Parser::~Parser((Parser *)local_d8);
  std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr
            ((shared_ptr<const_Omega_h::Grammar> *)&parser.nonterminal_table.ncols);
  FiniteAutomaton::~FiniteAutomaton((FiniteAutomaton *)&indent_info.dedent_token);
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ReaderTablesPtr)
         RVar3.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReaderTablesPtr build_reader_tables(Language const& language) {
  auto lexer = build_lexer(language);
  auto indent_info = build_indent_info(language);
  auto grammar = build_grammar(language);
  auto parser = accept_parser(build_lalr1_parser(grammar));
  return ReaderTablesPtr(new ReaderTables({parser, lexer, indent_info}));
}